

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall Clasp::mt::ParallelSolve::allocThread(ParallelSolve *this,uint32 id,Solver *s)

{
  ulong uVar1;
  void *pvVar2;
  uint in_ESI;
  long in_RDI;
  size_t sz;
  uint32 n;
  ParallelHandler **in_stack_ffffffffffffffb8;
  ParallelHandler **in_stack_ffffffffffffffc0;
  Solver *s_00;
  ParallelSolve *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint32 in_stack_ffffffffffffffe4;
  
  if (*(long *)(in_RDI + 0x70) == 0) {
    in_stack_ffffffffffffffe4 = numThreads((ParallelSolve *)0x21c20d);
    uVar1 = SUB168(ZEXT416(in_stack_ffffffffffffffe4) * ZEXT816(8),0);
    if (SUB168(ZEXT416(in_stack_ffffffffffffffe4) * ZEXT816(8),8) != 0) {
      uVar1 = 0xffffffffffffffff;
    }
    pvVar2 = operator_new__(uVar1);
    *(void **)(in_RDI + 0x70) = pvVar2;
    in_stack_ffffffffffffffd8 = (ParallelSolve *)0x0;
    std::fill<Clasp::mt::ParallelHandler**,Clasp::mt::ParallelHandler*>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(ParallelHandler **)0x21c268);
  }
  s_00 = (Solver *)0x80;
  pvVar2 = alignedAllocChecked((size_t)in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
  ParallelHandler::ParallelHandler
            ((ParallelHandler *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,s_00);
  *(void **)(*(long *)(in_RDI + 0x70) + (ulong)in_ESI * 8) = pvVar2;
  return;
}

Assistant:

void ParallelSolve::allocThread(uint32 id, Solver& s) {
	if (!thread_) {
		uint32 n = numThreads();
		thread_  = new ParallelHandler*[n];
		std::fill(thread_, thread_+n, static_cast<ParallelHandler*>(0));
	}
	size_t sz   = ((sizeof(ParallelHandler)+63) / 64) * 64;
	thread_[id] = new (alignedAllocChecked(sz)) ParallelHandler(*this, s);
}